

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

table_format_info * __thiscall
toml::basic_value<toml::type_config>::as_table_fmt(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == table) {
    return (table_format_info *)((long)&this->field_1 + 8);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_table_fmt()","");
  throw_bad_cast(this,&local_38,table);
}

Assistant:

table_format_info& as_table_fmt()
    {
        if(this->type_ != value_t::table)
        {
            this->throw_bad_cast("toml::value::as_table_fmt()", value_t::table);
        }
        return this->table_.format;
    }